

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

baseHolder * __thiscall
cs_impl::any::
holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>
::duplicate(holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>
            *this)

{
  baseHolder *pbVar1;
  allocator_type local_11;
  
  if ((_DAT_00340798 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x38);
  }
  else {
    pbVar1 = *(baseHolder **)(&init_extensions()::extensions_initiator + _DAT_00340798 * 8);
    _DAT_00340798 = _DAT_00340798 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__holder_0032de58;
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                  *)(pbVar1 + 1),
                 &(this->mDat).
                  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                 ,&local_11);
  return pbVar1;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}